

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O1

void __thiscall Peer::Peer(Peer *this,P2PSocket *socket,SocketResource peer,int num)

{
  ushort uVar1;
  char *pcVar2;
  pointer pcVar3;
  uint uVar4;
  Socket __fd;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  char *__s;
  undefined8 *puVar8;
  uint uVar9;
  ulong *puVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  socklen_t len;
  sockaddr_in address;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  socklen_t local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string *local_50;
  undefined1 local_48 [8];
  char acStack_40 [12];
  SocketResource local_34;
  
  this->m_master = socket;
  local_50 = (string *)&this->m_name;
  local_58 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_58;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->m_ip).field_2;
  (this->m_ip)._M_dataplus._M_p = (pointer)local_60;
  (this->m_ip)._M_string_length = 0;
  (this->m_ip).field_2._M_local_buf[0] = '\0';
  (this->m_socket).m_socket = peer.m_socket;
  this->m_flags = '\0';
  local_48._0_2_ = 0;
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  acStack_40[0] = '\0';
  acStack_40[1] = '\0';
  acStack_40[2] = '\0';
  acStack_40[3] = '\0';
  acStack_40[4] = '\0';
  acStack_40[5] = '\0';
  acStack_40[6] = '\0';
  acStack_40[7] = '\0';
  local_64 = 0x10;
  local_34.m_socket = peer.m_socket;
  __fd = SocketResource::resource(&local_34);
  iVar5 = getpeername(__fd,(sockaddr *)local_48,&local_64);
  if (iVar5 == -1) {
    uVar13 = -num;
    if (0 < num) {
      uVar13 = num;
    }
    __len = 1;
    if (9 < uVar13) {
      uVar12 = (ulong)uVar13;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00109f43;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00109f43;
        }
        if (uVar9 < 10000) goto LAB_00109f43;
        uVar12 = uVar12 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_00109f43:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,(char)__len - (char)(num >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)num >> 0x1f) + (long)local_c8),__len,uVar13);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x10e309);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_98 = *puVar10;
      lStack_90 = plVar6[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar10;
      local_a8 = (ulong *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_78 = *plVar11;
      lStack_70 = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar11;
      local_88 = (long *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_88,local_80);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
  }
  this->m_port = local_48._2_2_ << 8 | (ushort)local_48._2_2_ >> 8;
  __s = inet_ntoa((in_addr)local_48._4_4_);
  pcVar2 = (char *)(this->m_ip)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->m_ip,0,pcVar2,(ulong)__s);
  pcVar3 = (this->m_ip)._M_dataplus._M_p;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (this->m_ip)._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  uVar1 = this->m_port;
  uVar13 = 1;
  if (((9 < uVar1) && (uVar13 = 2, 99 < uVar1)) && (uVar13 = 3, 999 < uVar1)) {
    uVar13 = 5 - (uVar1 < 10000);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar13);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8,uVar13,(uint)uVar1);
  uVar12 = 0xf;
  if (local_a8 != &local_98) {
    uVar12 = local_98;
  }
  if (uVar12 < (ulong)(local_c0 + local_a0)) {
    uVar12 = 0xf;
    if (local_c8 != local_b8) {
      uVar12 = local_b8[0];
    }
    if ((ulong)(local_c0 + local_a0) <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0010a1da;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8);
LAB_0010a1da:
  local_88 = &local_78;
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_78 = *plVar6;
    lStack_70 = puVar8[3];
  }
  else {
    local_78 = *plVar6;
    local_88 = (long *)*puVar8;
  }
  local_80 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  std::__cxx11::string::operator=(local_50,(string *)&local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  this->m_connected = true;
  return;
}

Assistant:

Peer::Peer(P2PSocket *socket, SocketResource peer, int num)
    : m_master(socket), m_socket(peer), m_flags{0}
{
    struct sockaddr_in address;
    std::memset(&address, 0, sizeof address);
    socklen_t len = sizeof(address);
    int ret = ::getpeername(peer.resource(), (struct sockaddr *)&address, &len);
    if (ret == -1)
        std::cout << "New peer connection " + std::to_string(num) + " failed." << std::endl;
    m_port = ntohs(address.sin_port);
    m_ip = ::inet_ntoa(address.sin_addr);
    m_name = m_ip + ":" + std::to_string(m_port);
    m_connected = true;
}